

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * hashToDir(string *__return_storage_ptr__,string *hash_code)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  bVar1 = std::operator==(hash_code,"Stage");
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&STAGE_DIR_abi_cxx11_);
  }
  else {
    bVar1 = std::operator==(hash_code,"Work");
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,".",(allocator *)&bStack_38);
    }
    else {
      std::operator+(&bStack_38,&COMMITS_DIR_abi_cxx11_,"/");
      std::operator+(__return_storage_ptr__,&bStack_38,hash_code);
      std::__cxx11::string::~string((string *)&bStack_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String hashToDir(String hash_code){
    if(hash_code == "Stage"){
        return STAGE_DIR;
    }
    if(hash_code == "Work"){
        return ".";
    }
    return COMMITS_DIR + "/" + hash_code;
}